

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

void cconv_substruct_init(CTState *cts,CType *d,uint8_t *dp,TValue *o,MSize len,MSize *ip)

{
  CType *d_00;
  CTypeID1 CVar1;
  uint uVar2;
  CType *pCVar3;
  CTypeID1 CVar4;
  
  CVar4 = d->sib;
LAB_0014c091:
  do {
    if (CVar4 == 0) {
      return;
    }
    pCVar3 = cts->tab;
    d_00 = pCVar3 + CVar4;
    CVar1 = pCVar3[CVar4].sib;
    uVar2 = pCVar3[CVar4].info;
    CVar4 = CVar1;
    if ((uVar2 >> 0x1c) - 9 < 2) {
      if ((d_00->name).gcptr32 == 0) goto LAB_0014c091;
      uVar2 = *ip;
      if (len <= uVar2) {
        return;
      }
      *ip = uVar2 + 1;
      if ((d_00->info & 0xf0000000) == 0x90000000) {
        lj_cconv_ct_tv(cts,(CType *)((long)&pCVar3->info + (ulong)((d_00->info & 0xffff) << 4)),
                       dp + d_00->size,o + uVar2,0);
      }
      else {
        lj_cconv_bf_tv(cts,d_00,dp + d_00->size,o + uVar2);
      }
    }
    else {
      if ((uVar2 & 0xf0ff0000) != 0x80030000) goto LAB_0014c091;
      cconv_substruct_init
                (cts,(CType *)((long)&pCVar3->info + (ulong)((uVar2 & 0xffff) << 4)),dp + d_00->size
                 ,o,len,ip);
    }
    if ((d->info & 0x800000) != 0) {
      return;
    }
  } while( true );
}

Assistant:

static void cconv_substruct_init(CTState *cts, CType *d, uint8_t *dp,
				 TValue *o, MSize len, MSize *ip)
{
  CTypeID id = d->sib;
  while (id) {
    CType *df = ctype_get(cts, id);
    id = df->sib;
    if (ctype_isfield(df->info) || ctype_isbitfield(df->info)) {
      MSize i = *ip;
      if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
      if (i >= len) break;
      *ip = i + 1;
      if (ctype_isfield(df->info))
	lj_cconv_ct_tv(cts, ctype_rawchild(cts, df), dp+df->size, o + i, 0);
      else
	lj_cconv_bf_tv(cts, df, dp+df->size, o + i);
      if ((d->info & CTF_UNION)) break;
    } else if (ctype_isxattrib(df->info, CTA_SUBTYPE)) {
      cconv_substruct_init(cts, ctype_rawchild(cts, df),
			   dp+df->size, o, len, ip);
      if ((d->info & CTF_UNION)) break;
    }  /* Ignore all other entries in the chain. */
  }
}